

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer pIVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Image *this;
  vector<Image,_std::allocator<Image>_> pymask_images;
  ofstream out;
  char padding [192];
  int local_31c;
  vector<Image,_std::allocator<Image>_> local_318;
  ulong local_300;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  int aiStack_2d8 [54];
  ios_base local_200 [264];
  allocator<char> local_f8 [200];
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107140);
    }
    else {
      sVar3 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," pymask.pic cgamask.pic\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Converts pymask.pic from EGA to CGA and stores it in to cgamask.pic\n",0x44);
    iVar5 = 1;
  }
  else {
    pcVar1 = argv[2];
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,argv[1],local_f8);
    LoadEgaSpritesheet(&local_318,(string *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != &local_2e8) {
      operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
    }
    std::ofstream::ofstream((ofstream *)local_2f8,pcVar1,_S_bin);
    if (*(int *)((long)aiStack_2d8 + *(long *)(local_2f8._0_8_ + -0x18)) == 0) {
      if (local_318.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_318.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar7 = 0;
        do {
          pIVar2 = local_318.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
          cVar4 = (char)local_2f8;
          std::ostream::put(cVar4);
          std::ostream::put(cVar4);
          std::ostream::put(cVar4);
          std::ostream::put(cVar4);
          this = pIVar2 + uVar7;
          local_300 = uVar7;
          if (0 < this->height_) {
            local_31c = 0;
            do {
              if (0 < this->width_) {
                iVar5 = 3;
                do {
                  Image::Get(this,iVar5 + -3,local_31c);
                  Image::Get(this,iVar5 + -2,local_31c);
                  Image::Get(this,iVar5 + -1,local_31c);
                  if (this->width_ != iVar5) {
                    Image::Get(this,iVar5,local_31c);
                  }
                  std::ostream::put((char)local_2f8);
                  iVar6 = iVar5 + 1;
                  iVar5 = iVar5 + 4;
                } while (iVar6 < this->width_);
              }
              local_31c = local_31c + 1;
            } while (local_31c < this->height_);
          }
          std::ostream::write(local_2f8,(long)local_f8);
          uVar7 = local_300 + 1;
        } while (uVar7 < (ulong)((long)local_318.super__Vector_base<Image,_std::allocator<Image>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_318.super__Vector_base<Image,_std::allocator<Image>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 5));
      }
      iVar5 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Couldn\'t open: ",0xf);
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107140);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar3);
      }
      iVar5 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    }
    local_2f8._0_8_ = _VTT;
    *(undefined8 *)(local_2f8 + *(long *)(_VTT + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)(local_2f8 + 8));
    std::ios_base::~ios_base(local_200);
    std::vector<Image,_std::allocator<Image>_>::~vector(&local_318);
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
  if (argc < 3) {
    std::cerr << "Usage: " << argv[0] << " pymask.pic cgamask.pic\n";
    std::cerr << "Converts pymask.pic from EGA to CGA and stores it in to "
                 "cgamask.pic\n";
    return 1;
  }

  auto const pymask_filename = argv[1];
  auto const cgamask_filename = argv[2];

  auto const pymask_images = LoadEgaSpritesheet(pymask_filename);

  std::ofstream out(cgamask_filename, std::ios_base::binary);
  if (!out.good()) {
    std::cerr << "Couldn't open: " << cgamask_filename << "\n";
    return 1;
  }

  for (auto i = 0; i < pymask_images.size(); ++i) {
    auto const& img = pymask_images[i];

    // First, write "CGA header". If this is missing then the data will be
    // ignored.
    out.put(0x0E);
    out.put(0x00);
    out.put(0x0E);
    out.put(0x00);

    // Then Dump image (fit width=15 into cell of size 16)
    for (auto y = 0; y < img.GetHeight(); ++y) {
      for (auto x = 0; x < img.GetWidth(); x += 4) {
        // TODO more generic function that handles incomplete rows
        auto c = (img.Get(x, y) == color_white ? 0b11000000 : 0) |
                 (img.Get(x + 1, y) == color_white ? 0b00110000 : 0) |
                 (img.Get(x + 2, y) == color_white ? 0b00001100 : 0);

        // Non-full row (can happen because image data is 15x15)
        if (img.GetWidth() - x != 3) {
          c |= img.Get(x + 3, y) == color_white ? 0b00000011 : 0;
        }

        out.put(c);
      }
    }

    // finally Write 192 bytes of garbage
    char padding[192];
    out.write(padding, sizeof(padding));
  }

  return 0;
}